

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O3

unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> __thiscall
duckdb::AllocateBlock
          (duckdb *this,BlockManager *block_manager,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
          *reusable_buffer,block_id_t block_id)

{
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var1;
  pointer pFVar2;
  type pFVar3;
  
  if ((reusable_buffer->
      super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
      super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
      super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl == (FileBuffer *)0x0) {
    (*block_manager->_vptr_BlockManager[3])(this,block_manager,block_id,0);
  }
  else {
    pFVar2 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
             operator->(reusable_buffer);
    if (pFVar2->type == BLOCK) {
      pFVar3 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
               operator*(reusable_buffer);
      pFVar3[1]._vptr_FileBuffer = (_func_int **)block_id;
      _Var1._M_head_impl =
           (reusable_buffer->
           super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
           super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
           super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
      (reusable_buffer->
      super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
      super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
      super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
      *(FileBuffer **)this = _Var1._M_head_impl;
    }
    else {
      (*block_manager->_vptr_BlockManager[3])
                (this,block_manager,block_id,
                 (reusable_buffer->
                 super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
                 .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl);
      _Var1._M_head_impl =
           (reusable_buffer->
           super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
           super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
           super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
      (reusable_buffer->
      super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
      super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
      super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
      if (_Var1._M_head_impl != (FileBuffer *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_FileBuffer + 8))();
      }
    }
  }
  return (unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>_>)
         (unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>_>)this;
}

Assistant:

unique_ptr<Block> AllocateBlock(BlockManager &block_manager, unique_ptr<FileBuffer> reusable_buffer,
                                block_id_t block_id) {
	if (reusable_buffer) {
		// re-usable buffer: re-use it
		if (reusable_buffer->GetBufferType() == FileBufferType::BLOCK) {
			// we can reuse the buffer entirely
			auto &block = reinterpret_cast<Block &>(*reusable_buffer);
			block.id = block_id;
			return unique_ptr_cast<FileBuffer, Block>(std::move(reusable_buffer));
		}
		auto block = block_manager.CreateBlock(block_id, reusable_buffer.get());
		reusable_buffer.reset();
		return block;
	} else {
		// no re-usable buffer: allocate a new block
		return block_manager.CreateBlock(block_id, nullptr);
	}
}